

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inet_socket_address.c
# Opt level: O2

void test_init_inet_socket_address_wrong_family(void)

{
  cio_error cVar1;
  uint8_t ipv4_address [4];
  cio_inet_address address;
  cio_socket_address sock_addr;
  
  ipv4_address[0] = 0xac;
  ipv4_address[1] = '\x13';
  ipv4_address[2] = '\x01';
  ipv4_address[3] = '\x01';
  cVar1 = cio_init_inet_address(&address,ipv4_address,4);
  UnityAssertEqualNumber
            (0,(long)cVar1,"initialization of IPv4 inet address failed!",0x54,
             UNITY_DISPLAY_STYLE_INT);
  address.impl.family = CIO_ADDRESS_FAMILY_UNSPEC;
  cVar1 = cio_init_inet_socket_address(&sock_addr,&address,0xc);
  UnityAssertEqualNumber
            (-0x61,(long)cVar1,
             "initialization of inet socket address did not fail with wrong address family!",0x59,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_inet_socket_address_wrong_family(void)
{
	uint8_t ipv4_address[4] = {172, 19, 1, 1};
	struct cio_inet_address address;
	enum cio_error err = cio_init_inet_address(&address, ipv4_address, sizeof(ipv4_address));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "initialization of IPv4 inet address failed!");

	address.impl.family = CIO_ADDRESS_FAMILY_UNSPEC;
	struct cio_socket_address sock_addr;
	err = cio_init_inet_socket_address(&sock_addr, &address, 12);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_ADDRESS_FAMILY_NOT_SUPPORTED, err, "initialization of inet socket address did not fail with wrong address family!");
}